

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int stbi_jpeg_test_memory(stbi_uc *buffer,int len)

{
  uint8 uVar1;
  jpeg j;
  jpeg local_3710;
  
  local_3710.s.img_file = (FILE *)0x0;
  local_3710.s.img_buffer_end = buffer + len;
  local_3710.marker = 0xff;
  local_3710.s.img_buffer = buffer;
  uVar1 = get_marker(&local_3710);
  if (uVar1 != 0xd8) {
    failure_reason = "Corrupt JPEG";
  }
  return (uint)(uVar1 == 0xd8);
}

Assistant:

int stbi_jpeg_test_memory(stbi_uc const *buffer, int len)
{
   jpeg j;
   start_mem(&j.s, buffer,len);
   return decode_jpeg_header(&j, SCAN_type);
}